

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall kj::anon_unknown_35::InMemoryDirectory::exists(InMemoryDirectory *this,PathPtr path)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  PathPtr path_00;
  undefined1 uVar1;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar2;
  size_t sVar3;
  String *pSVar4;
  char *pcVar5;
  String *ptrCopy;
  StringPtr name;
  StringPtr name_00;
  Path newPath;
  undefined1 local_48 [24];
  
  sVar3 = path.parts.size_;
  pSVar4 = path.parts.ptr;
  if (sVar3 == 0) {
    uVar1 = 1;
  }
  else if (sVar3 == 1) {
    this_00 = &this->impl;
    kj::_::Mutex::lock(&this_00->mutex,SHARED);
    sVar3 = (pSVar4->content).size_;
    if (sVar3 == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pSVar4->content).ptr;
    }
    name.content.size_ = sVar3 + (sVar3 == 0);
    name.content.ptr = pcVar5;
    MVar2 = Impl::tryGetEntry(&(this->impl).value,name);
    uVar1 = MVar2.ptr != (EntryImpl *)0x0;
    if ((MVar2.ptr == (EntryImpl *)0x0) || (((MVar2.ptr)->node).tag != 3)) {
      kj::_::Mutex::unlock(&this_00->mutex,SHARED);
    }
    else {
      SymlinkNode::parse((Path *)local_48,(SymlinkNode *)&((MVar2.ptr)->node).field_1);
      kj::_::Mutex::unlock(&this_00->mutex,SHARED);
      path_00.parts.size_ = local_48._8_8_;
      path_00.parts.ptr = (String *)local_48._0_8_;
      uVar1 = exists(this,path_00);
      if ((FsNode)local_48._0_8_ != (FsNode)0x0) {
        (***(_func_int ***)local_48._16_8_)
                  (local_48._16_8_,local_48._0_8_,0x18,local_48._8_8_,local_48._8_8_,
                   ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      }
    }
  }
  else {
    if ((pSVar4->content).size_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pSVar4->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar5;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)local_48,name_00);
    if ((_func_int **)local_48._8_8_ == (_func_int **)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (**(code **)(*(_func_int **)local_48._8_8_ + 0x40))
                        (local_48._8_8_,pSVar4 + 1,sVar3 - 1);
      (*(code *)**(undefined8 **)local_48._0_8_)
                (local_48._0_8_,local_48._8_8_ + *(long *)(*(_func_int **)local_48._8_8_ + -0x10));
    }
  }
  return (bool)uVar1;
}

Assistant:

bool exists(PathPtr path) const override {
    if (path.size() == 0) {
      return true;
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_MAYBE(entry, lock->tryGetEntry(path[0])) {
        return exists(lock, *entry);
      } else {
        return false;
      }
    } else {
      KJ_IF_MAYBE(subdir, tryGetParent(path[0])) {
        return subdir->get()->exists(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }